

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLinker.cpp
# Opt level: O2

int __thiscall COLLADASaxFWL::FormulasLinker::link(FormulasLinker *this,char *__from,char *__to)

{
  ulong uVar1;
  Formula *__from_00;
  size_t sVar2;
  INode **ppIVar3;
  int iVar4;
  undefined4 extraout_var;
  ulong uVar5;
  size_t j;
  size_t sVar6;
  bool success;
  
  uVar1 = this->mFormulas->mCount;
  for (uVar5 = 0; uVar5 != uVar1; uVar5 = uVar5 + 1) {
    __from_00 = this->mFormulas->mData[uVar5];
    sVar2 = (__from_00->mMathmlAsts).mCount;
    for (sVar6 = 0; sVar2 != sVar6; sVar6 = sVar6 + 1) {
      ppIVar3 = (__from_00->mMathmlAsts).mData;
      iVar4 = link(this,(char *)__from_00,(char *)ppIVar3[sVar6]);
      ppIVar3[sVar6] = (INode *)CONCAT44(extraout_var,iVar4);
    }
  }
  return (int)CONCAT71((int7)(uVar5 >> 8),uVar1 <= uVar5);
}

Assistant:

bool FormulasLinker::link()
	{
		size_t formulasCount = mFormulas.getCount();
		for ( size_t i = 0; i < formulasCount; ++i)
		{
			COLLADAFW::Formula* formula = mFormulas[i];
			COLLADAFW::MathmlAstArray& asts = formula->getMathmlAsts();
			size_t astsCount = asts.getCount();
			for ( size_t j = 0; j < astsCount; ++j)
			{
				MathML::AST::INode*& astNode =  asts[j];
				bool success = true;
				astNode = link( formula, astNode, success);
				if ( !success )
					return false;
			}
		}
		return true;
	}